

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O2

number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
betterThreshold<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *__return_storage_ptr__,soplex *this,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *th,Real epsilon)

{
  bool bVar1;
  long lVar2;
  soplex *psVar3;
  cpp_dec_float<200U,_int,_void> *pcVar4;
  uint *puVar5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar6;
  byte bVar7;
  cpp_dec_float<200U,_int,_void> local_538;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<200U,_int,_void> local_430;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3b0;
  cpp_dec_float<200U,_int,_void> local_330;
  cpp_dec_float<200U,_int,_void> local_2b0;
  cpp_dec_float<200U,_int,_void> local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  cpp_dec_float<200U,_int,_void> local_130;
  uint local_b0 [28];
  undefined4 local_40;
  soplex local_3c;
  undefined8 local_38;
  
  bVar7 = 0;
  psVar3 = this;
  puVar5 = local_b0;
  for (lVar2 = 0x1c; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar5 = *(uint *)psVar3;
    psVar3 = psVar3 + 4;
    puVar5 = puVar5 + 1;
  }
  local_40 = *(undefined4 *)(this + 0x70);
  local_3c = this[0x74];
  local_38 = *(undefined8 *)(this + 0x78);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&local_130,0.1,(type *)0x0);
  bVar1 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_b0,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_130,1e-15);
  if (bVar1) {
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&local_538,10.0,(type *)0x0);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
              ((cpp_dec_float<200U,_int,_void> *)this,&local_538);
  }
  else {
    psVar3 = this;
    pnVar6 = &local_1b0;
    for (lVar2 = 0x1c; lVar2 != 0; lVar2 = lVar2 + -1) {
      (pnVar6->m_backend).data._M_elems[0] = *(uint *)psVar3;
      psVar3 = psVar3 + (ulong)bVar7 * -8 + 4;
      pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar6 + ((ulong)bVar7 * -2 + 1) * 4);
    }
    local_1b0.m_backend.exp = *(int *)(this + 0x70);
    local_1b0.m_backend.neg = *(bool *)(this + 0x74);
    local_1b0.m_backend._120_8_ = *(undefined8 *)(this + 0x78);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&local_230,0.9,(type *)0x0);
    bVar1 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_1b0,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_230,epsilon);
    if (bVar1) {
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&local_2b0,1.0,(type *)0x0);
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 0x1c;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems[8] = 0;
      result.m_backend.data._M_elems[9] = 0;
      result.m_backend.data._M_elems[10] = 0;
      result.m_backend.data._M_elems[0xb] = 0;
      result.m_backend.data._M_elems[0xc] = 0;
      result.m_backend.data._M_elems[0xd] = 0;
      result.m_backend.data._M_elems[0xe] = 0;
      result.m_backend.data._M_elems[0xf] = 0;
      result.m_backend.data._M_elems[0x10] = 0;
      result.m_backend.data._M_elems[0x11] = 0;
      result.m_backend.data._M_elems[0x12] = 0;
      result.m_backend.data._M_elems[0x13] = 0;
      result.m_backend.data._M_elems[0x14] = 0;
      result.m_backend.data._M_elems[0x15] = 0;
      result.m_backend.data._M_elems[0x16] = 0;
      result.m_backend.data._M_elems[0x17] = 0;
      result.m_backend.data._M_elems[0x18] = 0;
      result.m_backend.data._M_elems[0x19] = 0;
      result.m_backend.data._M_elems._104_5_ = 0;
      result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result.m_backend,(cpp_dec_float<200U,_int,_void> *)this,&local_2b0);
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&local_330,2.0,(type *)0x0);
      local_538.fpclass = cpp_dec_float_finite;
      local_538.prec_elem = 0x1c;
      local_538.data._M_elems[0] = 0;
      local_538.data._M_elems[1] = 0;
      local_538.data._M_elems[2] = 0;
      local_538.data._M_elems[3] = 0;
      local_538.data._M_elems[4] = 0;
      local_538.data._M_elems[5] = 0;
      local_538.data._M_elems[6] = 0;
      local_538.data._M_elems[7] = 0;
      local_538.data._M_elems[8] = 0;
      local_538.data._M_elems[9] = 0;
      local_538.data._M_elems[10] = 0;
      local_538.data._M_elems[0xb] = 0;
      local_538.data._M_elems[0xc] = 0;
      local_538.data._M_elems[0xd] = 0;
      local_538.data._M_elems[0xe] = 0;
      local_538.data._M_elems[0xf] = 0;
      local_538.data._M_elems[0x10] = 0;
      local_538.data._M_elems[0x11] = 0;
      local_538.data._M_elems[0x12] = 0;
      local_538.data._M_elems[0x13] = 0;
      local_538.data._M_elems[0x14] = 0;
      local_538.data._M_elems[0x15] = 0;
      local_538.data._M_elems[0x16] = 0;
      local_538.data._M_elems[0x17] = 0;
      local_538.data._M_elems[0x18] = 0;
      local_538.data._M_elems[0x19] = 0;
      local_538.data._M_elems._104_5_ = 0;
      local_538.data._M_elems[0x1b]._1_3_ = 0;
      local_538.exp = 0;
      local_538.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&local_538,&result.m_backend,&local_330);
      pcVar4 = &local_538;
      psVar3 = this;
      for (lVar2 = 0x1c; lVar2 != 0; lVar2 = lVar2 + -1) {
        *(uint *)psVar3 = (pcVar4->data)._M_elems[0];
        pcVar4 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar4 + (ulong)bVar7 * -8 + 4);
        psVar3 = psVar3 + (ulong)bVar7 * -8 + 4;
      }
      *(int *)(this + 0x70) = local_538.exp;
      this[0x74] = (soplex)local_538.neg;
    }
    else {
      psVar3 = this;
      pnVar6 = &local_3b0;
      for (lVar2 = 0x1c; lVar2 != 0; lVar2 = lVar2 + -1) {
        (pnVar6->m_backend).data._M_elems[0] = *(uint *)psVar3;
        psVar3 = psVar3 + (ulong)bVar7 * -8 + 4;
        pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)pnVar6 + ((ulong)bVar7 * -2 + 1) * 4);
      }
      local_3b0.m_backend.exp = *(int *)(this + 0x70);
      local_3b0.m_backend.neg = *(bool *)(this + 0x74);
      local_3b0.m_backend._120_8_ = *(undefined8 *)(this + 0x78);
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&local_430,0.999,(type *)0x0);
      bVar1 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                        (&local_3b0,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_430,epsilon);
      if (!bVar1) goto LAB_00136ba7;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&local_538,0.99999,(type *)0x0);
      pcVar4 = &local_538;
      psVar3 = this;
      for (lVar2 = 0x1c; lVar2 != 0; lVar2 = lVar2 + -1) {
        *(uint *)psVar3 = (pcVar4->data)._M_elems[0];
        pcVar4 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar4 + (ulong)bVar7 * -8 + 4);
        psVar3 = psVar3 + (ulong)bVar7 * -8 + 4;
      }
      *(int *)(this + 0x70) = local_538.exp;
      this[0x74] = (soplex)local_538.neg;
    }
    *(undefined8 *)(this + 0x78) = local_538._120_8_;
  }
LAB_00136ba7:
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (&__return_storage_ptr__->m_backend,(cpp_dec_float<200U,_int,_void> *)this);
  return __return_storage_ptr__;
}

Assistant:

static R betterThreshold(R th, Real epsilon)
{
   assert(th < R(1.0));

   if(LT(th, R(0.1), 1e-15))
      th *= R(10.0);
   else if(LT(th, R(0.9), epsilon))
      th = (th + R(1.0)) / R(2.0);
   else if(LT(th, R(0.999), epsilon))
      th = R(0.99999);

   assert(th < R(1.0));

   return th;
}